

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O1

int demo_button_proc(DEMO_MENU *item,int msg,int extra)

{
  int iVar1;
  char *format;
  undefined8 in_XMM1_Qa;
  
  if (msg == 2) {
    if ((extra == 0x20) || (iVar1 = 1000, extra == 0xd)) {
      if (item->on_activate != (_func_void_DEMO_MENU_ptr *)0x0) {
        (*item->on_activate)(item);
      }
      play_sound_id(7,0xff,0x80,-100,0);
      iVar1 = item->extra;
    }
  }
  else if (msg == 1) {
    format = (char *)al_map_rgb(0xff,0xff,(((uint)item->flags >> 1 & 1) != 0) + -1);
    shadow_textprintf((ALLEGRO_FONT *)demo_data[1].dat,screen_width / 2,extra,2,(int)item->name,
                      format,in_XMM1_Qa);
    iVar1 = 1000;
  }
  else {
    iVar1 = 1000;
    if ((msg & 0xfffffffeU) == 4) {
      iVar1 = demo_text_proc(item,msg,extra);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int demo_button_proc(DEMO_MENU * item, int msg, int extra)
{
   ALLEGRO_COLOR col;

   if (msg == DEMO_MENU_MSG_DRAW) {
      if (item->flags & DEMO_MENU_SELECTED) {
         col = al_map_rgb(255, 255, 0);
      } else {
         col = al_map_rgb(255, 255, 255);
      }

      shadow_textprintf(demo_font, screen_width / 2,
                      extra, col, 2, item->name);
   } else if (msg == DEMO_MENU_MSG_CHAR) {
      switch (extra) {
         case 13:
         case 32:
            if (item->on_activate) {
               item->on_activate(item);
            }

            play_sound_id(DEMO_SAMPLE_BUTTON, 255, 128, -freq_variation, 0);
            return item->extra;
            break;
      }
   } else if (msg == DEMO_MENU_MSG_WIDTH || msg == DEMO_MENU_MSG_HEIGHT) {
      return demo_text_proc(item, msg, extra);
   }

   return DEMO_MENU_CONTINUE;
}